

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

bool __thiscall
ReplaceExtraCompilerCacheKey::operator==
          (ReplaceExtraCompilerCacheKey *this,ReplaceExtraCompilerCacheKey *f)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = hashCode(this);
  sVar3 = hashCode(f);
  if ((sVar2 == sVar3) && (f->forShell == this->forShell)) {
    bVar1 = comparesEqual(&f->in,&this->in);
    if (bVar1) {
      bVar1 = comparesEqual(&f->out,&this->out);
      if (bVar1) {
        bVar1 = comparesEqual(&f->var,&this->var);
        if (bVar1) {
          bVar1 = comparesEqual(&f->pwd,&this->pwd);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ReplaceExtraCompilerCacheKey::operator==(const ReplaceExtraCompilerCacheKey &f) const
{
    return (hashCode() == f.hashCode() &&
            f.forShell == forShell &&
            f.in == in &&
            f.out == out &&
            f.var == var &&
            f.pwd == pwd);
}